

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O0

FinalizePsbtResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::FinalizePsbtRequestStruct,cfd::js::api::FinalizePsbtResponseStruct>
          (FinalizePsbtResponseStruct *__return_storage_ptr__,api *this,
          FinalizePsbtRequestStruct *request,
          function<cfd::js::api::FinalizePsbtResponseStruct_(const_cfd::js::api::FinalizePsbtRequestStruct_&)>
          *call_function,string *fuction_name)

{
  CfdException *cfde;
  exception *except;
  FinalizePsbtResponseStruct local_150;
  undefined1 local_29;
  function<cfd::js::api::FinalizePsbtResponseStruct_(const_cfd::js::api::FinalizePsbtRequestStruct_&)>
  *local_28;
  string *fuction_name_local;
  function<cfd::js::api::FinalizePsbtResponseStruct_(const_cfd::js::api::FinalizePsbtRequestStruct_&)>
  *call_function_local;
  FinalizePsbtRequestStruct *request_local;
  FinalizePsbtResponseStruct *response;
  
  local_29 = 0;
  local_28 = call_function;
  fuction_name_local = &request->psbt;
  call_function_local =
       (function<cfd::js::api::FinalizePsbtResponseStruct_(const_cfd::js::api::FinalizePsbtRequestStruct_&)>
        *)this;
  request_local = (FinalizePsbtRequestStruct *)__return_storage_ptr__;
  FinalizePsbtResponseStruct::FinalizePsbtResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::FinalizePsbtResponseStruct_(const_cfd::js::api::FinalizePsbtRequestStruct_&)>
  ::operator()(&local_150,
               (function<cfd::js::api::FinalizePsbtResponseStruct_(const_cfd::js::api::FinalizePsbtRequestStruct_&)>
                *)request,(FinalizePsbtRequestStruct *)call_function_local);
  FinalizePsbtResponseStruct::operator=(__return_storage_ptr__,&local_150);
  FinalizePsbtResponseStruct::~FinalizePsbtResponseStruct(&local_150);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}